

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

PHYSFS_Io * ZIP_openRead(void *opaque,char *filename)

{
  _func_void_PHYSFS_Io_ptr *p_Var1;
  mz_internal_state *pmVar2;
  void *pvVar3;
  mz_free_func p_Var4;
  _func_PHYSFS_sint64_PHYSFS_Io_ptr_void_ptr_PHYSFS_uint64 *p_Var5;
  bool bVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  ZIPentry *entry;
  char *pcVar10;
  PHYSFS_Io *pPVar11;
  ZIPfileinfo *finfo;
  PHYSFS_Io *pPVar12;
  ZIPentry *pZVar13;
  PHYSFS_uint8 *pPVar14;
  PHYSFS_sint64 PVar15;
  long lVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  PHYSFS_ErrorCode errcode;
  PHYSFS_Io *pPVar19;
  PHYSFS_uint8 *pPVar20;
  size_t __n;
  byte bVar21;
  undefined1 auStack_58 [12];
  PHYSFS_uint8 local_4c [8];
  PHYSFS_uint8 crypto_header [12];
  
  bVar21 = 0;
  puVar17 = auStack_58;
  puVar18 = auStack_58;
  entry = (ZIPentry *)__PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,filename);
  if (entry == (ZIPentry *)0x0) {
    if (*(int *)((long)opaque + 0x2c) == 0) {
      pPVar20 = (PHYSFS_uint8 *)0x0;
      entry = (ZIPentry *)0x0;
    }
    else {
      pcVar10 = strrchr(filename,0x24);
      if (pcVar10 == (char *)0x0) {
        bVar6 = true;
        pPVar20 = (PHYSFS_uint8 *)0x0;
        entry = (ZIPentry *)0x0;
      }
      else {
        __n = (long)pcVar10 - (long)filename;
        if (__n + 1 < 0x100) {
          puVar17 = auStack_58 + -(__n + 0x18 & 0xfffffffffffffff0);
          puVar18 = puVar17;
        }
        else {
          puVar17 = (undefined1 *)0x0;
          puVar18 = auStack_58;
        }
        crypto_header._4_8_ = pcVar10;
        *(undefined8 *)(puVar18 + -8) = 0x115dff;
        pcVar10 = (char *)__PHYSFS_initSmallAlloc(puVar17,__n + 1);
        bVar6 = pcVar10 != (char *)0x0;
        if (pcVar10 == (char *)0x0) {
          *(undefined8 *)(puVar18 + -8) = 0x115e47;
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          pPVar20 = (PHYSFS_uint8 *)0x0;
          entry = (ZIPentry *)0x0;
        }
        else {
          *(undefined8 *)(puVar18 + -8) = 0x115e19;
          memcpy(pcVar10,filename,__n);
          pcVar10[__n] = '\0';
          *(undefined8 *)(puVar18 + -8) = 0x115e29;
          entry = (ZIPentry *)__PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,pcVar10);
          *(undefined8 *)(puVar18 + -8) = 0x115e34;
          __PHYSFS_smallFree(pcVar10);
          pPVar20 = (PHYSFS_uint8 *)(crypto_header._4_8_ + 1);
        }
      }
      puVar17 = puVar18;
      if (!bVar6) {
        return (PHYSFS_Io *)0x0;
      }
    }
  }
  else {
    pPVar20 = (PHYSFS_uint8 *)0x0;
    puVar17 = auStack_58;
  }
  if (entry == (ZIPentry *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
  pPVar11 = *(PHYSFS_Io **)((long)opaque + 0x20);
  *(undefined8 *)(puVar17 + -8) = 0x115c53;
  iVar8 = zip_resolve(pPVar11,(ZIPinfo *)opaque,entry);
  if (iVar8 == 0) {
    return (PHYSFS_Io *)0x0;
  }
  if ((entry->tree).isdir != 0) {
    *(undefined8 *)(puVar17 + -8) = 0x115c6c;
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_A_FILE);
    return (PHYSFS_Io *)0x0;
  }
  *(undefined8 *)(puVar17 + -8) = 0x115cd6;
  pPVar11 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
  errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  if (pPVar11 == (PHYSFS_Io *)0x0) {
    finfo = (ZIPfileinfo *)0x0;
  }
  else {
    *(undefined8 *)(puVar17 + -8) = 0x115cf2;
    finfo = (ZIPfileinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0xa8);
    if (finfo == (ZIPfileinfo *)0x0) {
      finfo = (ZIPfileinfo *)0x0;
LAB_00115e62:
      errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    }
    else {
      *(undefined8 *)(puVar17 + -8) = 0x115d0d;
      memset(finfo,0,0xa8);
      pPVar12 = *(PHYSFS_Io **)((long)opaque + 0x20);
      *(undefined8 *)(puVar17 + -8) = 0x115d1d;
      pPVar12 = zip_get_io(pPVar12,(ZIPinfo *)opaque,entry);
      iVar8 = (int)opaque;
      if (pPVar12 == (PHYSFS_Io *)0x0) goto LAB_00115e6c;
      finfo->io = pPVar12;
      pZVar13 = entry->symlink;
      if (entry->symlink == (ZIPentry *)0x0) {
        pZVar13 = entry;
      }
      finfo->entry = pZVar13;
      (finfo->stream).zalloc = (mz_alloc_func)0x0;
      (finfo->stream).zfree = (mz_free_func)0x0;
      (finfo->stream).opaque = (void *)0x0;
      *(undefined8 *)&(finfo->stream).data_type = 0;
      (finfo->stream).next_in = (uchar *)0x0;
      *(undefined8 *)&(finfo->stream).avail_in = 0;
      (finfo->stream).total_in = 0;
      (finfo->stream).next_out = (uchar *)0x0;
      *(undefined8 *)&(finfo->stream).avail_out = 0;
      (finfo->stream).total_out = 0;
      (finfo->stream).msg = (char *)0x0;
      (finfo->stream).state = (mz_internal_state *)0x0;
      (finfo->stream).adler = 0;
      (finfo->stream).reserved = 0;
      (finfo->stream).zalloc = zlibPhysfsAlloc;
      (finfo->stream).zfree = zlibPhysfsFree;
      (finfo->stream).opaque = &__PHYSFS_AllocatorHooks;
      if (pZVar13->compression_method != 0) {
        *(undefined8 *)(puVar17 + -8) = 0x115da0;
        pPVar14 = (PHYSFS_uint8 *)(*__PHYSFS_AllocatorHooks.Malloc)(0x4000);
        finfo->buffer = pPVar14;
        if (pPVar14 == (PHYSFS_uint8 *)0x0) goto LAB_00115e62;
        *(undefined8 *)(puVar17 + -8) = 0x115db9;
        iVar8 = mz_inflateInit2(&finfo->stream,iVar8);
        crypto_header._4_8_ = pPVar20;
        *(undefined8 *)(puVar17 + -8) = 0x115dc7;
        zlib_err(iVar8);
        pPVar20 = (PHYSFS_uint8 *)crypto_header._4_8_;
        if (iVar8 != 0) goto LAB_00115e6c;
      }
      if ((entry->general_bits & 1) != 0) {
        if (pPVar20 == (PHYSFS_uint8 *)0x0) {
          *(undefined8 *)(puVar17 + -8) = 0x115f1e;
          PHYSFS_setErrorCode(PHYSFS_ERR_BAD_PASSWORD);
          iVar8 = 0xc;
        }
        else {
          p_Var5 = pPVar12->read;
          *(undefined8 *)(puVar17 + -8) = 0x115eec;
          PVar15 = (*p_Var5)(pPVar12,local_4c,0xc);
          iVar8 = 0xc;
          if (PVar15 == 0xc) {
            *(undefined8 *)(puVar17 + -8) = 0x115f06;
            iVar9 = zip_prep_crypto_keys(finfo,local_4c,pPVar20);
            iVar8 = 0xc;
            if (iVar9 != 0) {
              iVar8 = 0;
            }
          }
        }
        if (iVar8 != 0xc) {
          if (iVar8 != 0) {
            return (PHYSFS_Io *)0x0;
          }
LAB_00115f30:
          pPVar12 = &ZIP_Io;
          pPVar19 = pPVar11;
          for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
            uVar7 = *(undefined4 *)&pPVar12->field_0x4;
            pPVar19->version = pPVar12->version;
            *(undefined4 *)&pPVar19->field_0x4 = uVar7;
            pPVar12 = (PHYSFS_Io *)((long)pPVar12 + ((ulong)bVar21 * -2 + 1) * 8);
            pPVar19 = (PHYSFS_Io *)((long)pPVar19 + (ulong)bVar21 * -0x10 + 8);
          }
          pPVar11->opaque = finfo;
          return pPVar11;
        }
        goto LAB_00115e6c;
      }
      errcode = PHYSFS_ERR_BAD_PASSWORD;
      if (pPVar20 == (PHYSFS_uint8 *)0x0) goto LAB_00115f30;
    }
  }
  *(undefined8 *)(puVar17 + -8) = 0x115e6c;
  PHYSFS_setErrorCode(errcode);
LAB_00115e6c:
  if (finfo != (ZIPfileinfo *)0x0) {
    pPVar12 = finfo->io;
    if (pPVar12 != (PHYSFS_Io *)0x0) {
      p_Var1 = pPVar12->destroy;
      *(undefined8 *)(puVar17 + -8) = 0x115e7d;
      (*p_Var1)(pPVar12);
    }
    pPVar20 = finfo->buffer;
    if (pPVar20 != (PHYSFS_uint8 *)0x0) {
      *(undefined8 *)(puVar17 + -8) = 0x115e8c;
      (*__PHYSFS_AllocatorHooks.Free)(pPVar20);
      pmVar2 = (finfo->stream).state;
      if (pmVar2 != (mz_internal_state *)0x0) {
        pvVar3 = (finfo->stream).opaque;
        p_Var4 = (finfo->stream).zfree;
        *(undefined8 *)(puVar17 + -8) = 0x115ea3;
        (*p_Var4)(pvVar3,pmVar2);
        (finfo->stream).state = (mz_internal_state *)0x0;
      }
    }
    *(undefined8 *)(puVar17 + -8) = 0x115eb4;
    (*__PHYSFS_AllocatorHooks.Free)(finfo);
  }
  if (pPVar11 != (PHYSFS_Io *)0x0) {
    *(undefined8 *)(puVar17 + -8) = 0x115ec2;
    (*__PHYSFS_AllocatorHooks.Free)(pPVar11);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *ZIP_openRead(void *opaque, const char *filename)
{
    PHYSFS_Io *retval = NULL;
    ZIPinfo *info = (ZIPinfo *) opaque;
    ZIPentry *entry = zip_find_entry(info, filename);
    ZIPfileinfo *finfo = NULL;
    PHYSFS_Io *io = NULL;
    PHYSFS_uint8 *password = NULL;

    /* if not found, see if maybe "$PASSWORD" is appended. */
    if ((!entry) && (info->has_crypto))
    {
        const char *ptr = strrchr(filename, '$');
        if (ptr != NULL)
        {
            const size_t len = (size_t) (ptr - filename);
            char *str = (char *) __PHYSFS_smallAlloc(len + 1);
            BAIL_IF(!str, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
            memcpy(str, filename, len);
            str[len] = '\0';
            entry = zip_find_entry(info, str);
            __PHYSFS_smallFree(str);
            password = (PHYSFS_uint8 *) (ptr + 1);
        } /* if */
    } /* if */

    BAIL_IF_ERRPASS(!entry, NULL);

    BAIL_IF_ERRPASS(!zip_resolve(info->io, info, entry), NULL);

    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);

    finfo = (ZIPfileinfo *) allocator.Malloc(sizeof (ZIPfileinfo));
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);
    memset(finfo, '\0', sizeof (ZIPfileinfo));

    io = zip_get_io(info->io, info, entry);
    GOTO_IF_ERRPASS(!io, ZIP_openRead_failed);
    finfo->io = io;
    finfo->entry = ((entry->symlink != NULL) ? entry->symlink : entry);
    initializeZStream(&finfo->stream);

    if (finfo->entry->compression_method != COMPMETH_NONE)
    {
        finfo->buffer = (PHYSFS_uint8 *) allocator.Malloc(ZIP_READBUFSIZE);
        if (!finfo->buffer)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);
        else if (zlib_err(inflateInit2(&finfo->stream, -MAX_WBITS)) != Z_OK)
            goto ZIP_openRead_failed;
    } /* if */

    if (!zip_entry_is_tradional_crypto(entry))
        GOTO_IF(password != NULL, PHYSFS_ERR_BAD_PASSWORD, ZIP_openRead_failed);
    else
    {
        PHYSFS_uint8 crypto_header[12];
        GOTO_IF(password == NULL, PHYSFS_ERR_BAD_PASSWORD, ZIP_openRead_failed);
        if (io->read(io, crypto_header, 12) != 12)
            goto ZIP_openRead_failed;
        else if (!zip_prep_crypto_keys(finfo, crypto_header, password))
            goto ZIP_openRead_failed;
    } /* if */

    memcpy(retval, &ZIP_Io, sizeof (PHYSFS_Io));
    retval->opaque = finfo;

    return retval;

ZIP_openRead_failed:
    if (finfo != NULL)
    {
        if (finfo->io != NULL)
            finfo->io->destroy(finfo->io);

        if (finfo->buffer != NULL)
        {
            allocator.Free(finfo->buffer);
            inflateEnd(&finfo->stream);
        } /* if */

        allocator.Free(finfo);
    } /* if */

    if (retval != NULL)
        allocator.Free(retval);

    return NULL;
}